

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicornafl.cpp
# Opt level: O0

void UCAFL::_uc_hook_block(uc_engine *uc,uint64_t address,uint32_t size,void *user_data)

{
  uint32_t uVar1;
  ulong uVar2;
  double __x;
  UCAFL *ucafl;
  uint64_t cur_loc;
  void *user_data_local;
  uint32_t size_local;
  uint64_t address_local;
  uc_engine *uc_local;
  
  uVar1 = afl_hash_ip(address);
  uVar2 = (ulong)(uVar1 & 0xffff) ^ *(ulong *)((long)user_data + 0x60);
  *(char *)(*(long *)((long)user_data + 0x50) + uVar2) =
       *(char *)(*(long *)((long)user_data + 0x50) + uVar2) + '\x01';
  *(ulong *)((long)user_data + 0x60) = (ulong)((uVar1 & 0xffff) >> 1);
  log(__x);
  return;
}

Assistant:

static void _uc_hook_block(uc_engine* uc, uint64_t address, uint32_t size,
                               void* user_data) {
        uint64_t cur_loc = afl_hash_ip(address) & (MAP_SIZE - 1);
        UCAFL* ucafl = (UCAFL*)user_data;

        ucafl->afl_area_ptr_[cur_loc ^ ucafl->afl_prev_loc_]++;
        ucafl->afl_prev_loc_ = cur_loc >> 1;

        ERR_CHILD("uc_hook_block address=0x%" PRIx64 " cur_loc=%" PRIu64
                  " prev_loc=%" PRIu64 "\n",
                  address, cur_loc, ucafl->afl_prev_loc_);
    }